

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestCRLF::Run(ParserTestCRLF *this)

{
  Test *pTVar1;
  bool bVar2;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  undefined1 local_1b0 [8];
  string err;
  ManifestParserOptions local_180;
  undefined1 local_178 [8];
  ManifestParser parser;
  State local_state;
  ParserTestCRLF *this_local;
  
  State::State((State *)&parser.quiet_);
  ManifestParserOptions::ManifestParserOptions(&local_180);
  ManifestParser::ManifestParser
            ((ManifestParser *)local_178,(State *)&parser.quiet_,(FileReader *)0x0,local_180);
  std::__cxx11::string::string((string *)local_1b0);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"# comment with crlf\r\n",&local_1d1);
  bVar2 = ManifestParser::ParseTest((ManifestParser *)local_178,&local_1d0,(string *)local_1b0);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x437,"parser.ParseTest(\"# comment with crlf\\r\\n\", &err)");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"foo = foo\nbar = bar\r\n",&local_1f9);
  bVar2 = ManifestParser::ParseTest((ManifestParser *)local_178,&local_1f8,(string *)local_1b0);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x438,"parser.ParseTest(\"foo = foo\\nbar = bar\\r\\n\", &err)");
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,
             "pool link_pool\r\n  depth = 15\r\n\r\nrule xyz\r\n  command = something$expand \r\n  description = YAY!\r\n"
             ,&local_221);
  bVar2 = ManifestParser::ParseTest((ManifestParser *)local_178,&local_220,(string *)local_1b0);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x43f,
             "parser.ParseTest( \"pool link_pool\\r\\n\" \"  depth = 15\\r\\n\\r\\n\" \"rule xyz\\r\\n\" \"  command = something$expand \\r\\n\" \"  description = YAY!\\r\\n\", &err)"
            );
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::__cxx11::string::~string((string *)local_1b0);
  State::~State((State *)&parser.quiet_);
  return;
}

Assistant:

TEST_F(ParserTest, CRLF) {
  State local_state;
  ManifestParser parser(&local_state, NULL);
  string err;

  EXPECT_TRUE(parser.ParseTest("# comment with crlf\r\n", &err));
  EXPECT_TRUE(parser.ParseTest("foo = foo\nbar = bar\r\n", &err));
  EXPECT_TRUE(parser.ParseTest(
      "pool link_pool\r\n"
      "  depth = 15\r\n\r\n"
      "rule xyz\r\n"
      "  command = something$expand \r\n"
      "  description = YAY!\r\n",
      &err));
}